

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

float128 float128_silence_nan_ppc64(float128 a,float_status *status)

{
  float128 fVar1;
  
  fVar1.high = a.high | 0x800000000000;
  fVar1.low = a.low;
  return fVar1;
}

Assistant:

float128 float128_silence_nan(float128 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    g_assert_not_reached();
#else
    if (snan_bit_is_one(status)) {
        return float128_default_nan(status);
    } else {
        a.high |= UINT64_C(0x0000800000000000);
        return a;
    }
#endif
}